

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TimeInMillis testing::internal::GetTimeInMillis(void)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *__lhs;
  time_point __rhs;
  rep rVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffd8;
  duration<long,_std::ratio<1L,_1000L>_> local_8;
  
  __lhs = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           *)std::chrono::_V2::system_clock::now();
  __rhs = std::chrono::_V2::system_clock::from_time_t((time_t)__lhs);
  std::chrono::operator-
            (__lhs,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)__rhs.__d.__r);
  local_8.__r = (rep)std::chrono::
                     duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                               (in_stack_ffffffffffffffd8);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_8);
  return rVar1;
}

Assistant:

TimeInMillis GetTimeInMillis() {
  return std::chrono::duration_cast<std::chrono::milliseconds>(
             std::chrono::system_clock::now() -
             std::chrono::system_clock::from_time_t(0))
      .count();
}